

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_subtract_sse2.c
# Opt level: O0

void subtract_8x4(int16_t *diff,ptrdiff_t diff_stride,uint16_t *src,ptrdiff_t src_stride,
                 uint16_t *pred,ptrdiff_t pred_stride)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 *puVar17;
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  long in_R9;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  puVar17 = (undefined8 *)((long)in_RDX + in_RCX * 2);
  uVar3 = *puVar17;
  uVar4 = puVar17[1];
  puVar17 = (undefined8 *)((long)in_RDX + in_RCX * 4);
  uVar5 = *puVar17;
  uVar6 = puVar17[1];
  puVar17 = (undefined8 *)((long)in_RDX + in_RCX * 6);
  uVar7 = *puVar17;
  uVar8 = puVar17[1];
  uVar9 = *in_R8;
  uVar10 = in_R8[1];
  puVar17 = (undefined8 *)((long)in_R8 + in_R9 * 2);
  uVar11 = *puVar17;
  uVar12 = puVar17[1];
  puVar17 = (undefined8 *)((long)in_R8 + in_R9 * 4);
  uVar13 = *puVar17;
  uVar14 = puVar17[1];
  puVar17 = (undefined8 *)((long)in_R8 + in_R9 * 6);
  uVar15 = *puVar17;
  uVar16 = puVar17[1];
  local_c8 = (short)uVar1;
  sStack_c6 = (short)((ulong)uVar1 >> 0x10);
  sStack_c4 = (short)((ulong)uVar1 >> 0x20);
  sStack_c2 = (short)((ulong)uVar1 >> 0x30);
  sStack_c0 = (short)uVar2;
  sStack_be = (short)((ulong)uVar2 >> 0x10);
  sStack_bc = (short)((ulong)uVar2 >> 0x20);
  sStack_ba = (short)((ulong)uVar2 >> 0x30);
  local_d8 = (short)uVar9;
  sStack_d6 = (short)((ulong)uVar9 >> 0x10);
  sStack_d4 = (short)((ulong)uVar9 >> 0x20);
  sStack_d2 = (short)((ulong)uVar9 >> 0x30);
  sStack_d0 = (short)uVar10;
  sStack_ce = (short)((ulong)uVar10 >> 0x10);
  sStack_cc = (short)((ulong)uVar10 >> 0x20);
  sStack_ca = (short)((ulong)uVar10 >> 0x30);
  local_e8 = (short)uVar3;
  sStack_e6 = (short)((ulong)uVar3 >> 0x10);
  sStack_e4 = (short)((ulong)uVar3 >> 0x20);
  sStack_e2 = (short)((ulong)uVar3 >> 0x30);
  sStack_e0 = (short)uVar4;
  sStack_de = (short)((ulong)uVar4 >> 0x10);
  sStack_dc = (short)((ulong)uVar4 >> 0x20);
  sStack_da = (short)((ulong)uVar4 >> 0x30);
  local_f8 = (short)uVar11;
  sStack_f6 = (short)((ulong)uVar11 >> 0x10);
  sStack_f4 = (short)((ulong)uVar11 >> 0x20);
  sStack_f2 = (short)((ulong)uVar11 >> 0x30);
  sStack_f0 = (short)uVar12;
  sStack_ee = (short)((ulong)uVar12 >> 0x10);
  sStack_ec = (short)((ulong)uVar12 >> 0x20);
  sStack_ea = (short)((ulong)uVar12 >> 0x30);
  local_108 = (short)uVar5;
  sStack_106 = (short)((ulong)uVar5 >> 0x10);
  sStack_104 = (short)((ulong)uVar5 >> 0x20);
  sStack_102 = (short)((ulong)uVar5 >> 0x30);
  sStack_100 = (short)uVar6;
  sStack_fe = (short)((ulong)uVar6 >> 0x10);
  sStack_fc = (short)((ulong)uVar6 >> 0x20);
  sStack_fa = (short)((ulong)uVar6 >> 0x30);
  local_118 = (short)uVar13;
  sStack_116 = (short)((ulong)uVar13 >> 0x10);
  sStack_114 = (short)((ulong)uVar13 >> 0x20);
  sStack_112 = (short)((ulong)uVar13 >> 0x30);
  sStack_110 = (short)uVar14;
  sStack_10e = (short)((ulong)uVar14 >> 0x10);
  sStack_10c = (short)((ulong)uVar14 >> 0x20);
  sStack_10a = (short)((ulong)uVar14 >> 0x30);
  local_128 = (short)uVar7;
  sStack_126 = (short)((ulong)uVar7 >> 0x10);
  sStack_124 = (short)((ulong)uVar7 >> 0x20);
  sStack_122 = (short)((ulong)uVar7 >> 0x30);
  sStack_120 = (short)uVar8;
  sStack_11e = (short)((ulong)uVar8 >> 0x10);
  sStack_11c = (short)((ulong)uVar8 >> 0x20);
  sStack_11a = (short)((ulong)uVar8 >> 0x30);
  local_138 = (short)uVar15;
  sStack_136 = (short)((ulong)uVar15 >> 0x10);
  sStack_134 = (short)((ulong)uVar15 >> 0x20);
  sStack_132 = (short)((ulong)uVar15 >> 0x30);
  sStack_130 = (short)uVar16;
  sStack_12e = (short)((ulong)uVar16 >> 0x10);
  sStack_12c = (short)((ulong)uVar16 >> 0x20);
  sStack_12a = (short)((ulong)uVar16 >> 0x30);
  *in_RDI = CONCAT26(sStack_c2 - sStack_d2,
                     CONCAT24(sStack_c4 - sStack_d4,
                              CONCAT22(sStack_c6 - sStack_d6,local_c8 - local_d8)));
  in_RDI[1] = CONCAT26(sStack_ba - sStack_ca,
                       CONCAT24(sStack_bc - sStack_cc,
                                CONCAT22(sStack_be - sStack_ce,sStack_c0 - sStack_d0)));
  puVar17 = (undefined8 *)((long)in_RDI + in_RSI * 2);
  *puVar17 = CONCAT26(sStack_e2 - sStack_f2,
                      CONCAT24(sStack_e4 - sStack_f4,
                               CONCAT22(sStack_e6 - sStack_f6,local_e8 - local_f8)));
  puVar17[1] = CONCAT26(sStack_da - sStack_ea,
                        CONCAT24(sStack_dc - sStack_ec,
                                 CONCAT22(sStack_de - sStack_ee,sStack_e0 - sStack_f0)));
  puVar17 = (undefined8 *)((long)in_RDI + in_RSI * 4);
  *puVar17 = CONCAT26(sStack_102 - sStack_112,
                      CONCAT24(sStack_104 - sStack_114,
                               CONCAT22(sStack_106 - sStack_116,local_108 - local_118)));
  puVar17[1] = CONCAT26(sStack_fa - sStack_10a,
                        CONCAT24(sStack_fc - sStack_10c,
                                 CONCAT22(sStack_fe - sStack_10e,sStack_100 - sStack_110)));
  puVar17 = (undefined8 *)((long)in_RDI + in_RSI * 6);
  *puVar17 = CONCAT26(sStack_122 - sStack_132,
                      CONCAT24(sStack_124 - sStack_134,
                               CONCAT22(sStack_126 - sStack_136,local_128 - local_138)));
  puVar17[1] = CONCAT26(sStack_11a - sStack_12a,
                        CONCAT24(sStack_11c - sStack_12c,
                                 CONCAT22(sStack_11e - sStack_12e,sStack_120 - sStack_130)));
  return;
}

Assistant:

static void subtract_8x4(int16_t *diff, ptrdiff_t diff_stride,
                         const uint16_t *src, ptrdiff_t src_stride,
                         const uint16_t *pred, ptrdiff_t pred_stride) {
  __m128i u0, u1, u2, u3;
  __m128i v0, v1, v2, v3;
  __m128i x0, x1, x2, x3;

  u0 = _mm_loadu_si128((__m128i const *)(src + 0 * src_stride));
  u1 = _mm_loadu_si128((__m128i const *)(src + 1 * src_stride));
  u2 = _mm_loadu_si128((__m128i const *)(src + 2 * src_stride));
  u3 = _mm_loadu_si128((__m128i const *)(src + 3 * src_stride));

  v0 = _mm_loadu_si128((__m128i const *)(pred + 0 * pred_stride));
  v1 = _mm_loadu_si128((__m128i const *)(pred + 1 * pred_stride));
  v2 = _mm_loadu_si128((__m128i const *)(pred + 2 * pred_stride));
  v3 = _mm_loadu_si128((__m128i const *)(pred + 3 * pred_stride));

  x0 = _mm_sub_epi16(u0, v0);
  x1 = _mm_sub_epi16(u1, v1);
  x2 = _mm_sub_epi16(u2, v2);
  x3 = _mm_sub_epi16(u3, v3);

  _mm_storeu_si128((__m128i *)(diff + 0 * diff_stride), x0);
  _mm_storeu_si128((__m128i *)(diff + 1 * diff_stride), x1);
  _mm_storeu_si128((__m128i *)(diff + 2 * diff_stride), x2);
  _mm_storeu_si128((__m128i *)(diff + 3 * diff_stride), x3);
}